

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O3

int big_file_mpi_write_records
              (BigFile *bf,BigRecordType *rtype,ptrdiff_t offset,size_t size,void *buf,
              int concurrency,MPI_Comm comm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  BigBlockPtr ptr;
  BigBlock block [1];
  BigArray array [1];
  long local_2f8;
  BigBlockPtr local_2c8;
  BigBlock local_2a8;
  BigArray local_258;
  
  if (rtype->nfield != 0) {
    local_2f8 = 0;
    uVar3 = 0;
    do {
      local_2c8.fileid = 0;
      local_2c8._4_4_ = 0;
      local_2c8.roffset = 0;
      local_2c8.aoffset = 0;
      iVar1 = big_record_view_field(rtype,(int)uVar3,&local_258,size,buf);
      if (iVar1 != 0) {
        iVar1 = 0x277;
        goto LAB_00104eb5;
      }
      iVar1 = big_file_mpi_open_block
                        (bf,&local_2a8,*(char **)(rtype->fields->dtype + local_2f8 + -8),comm);
      if (iVar1 != 0) {
        iVar1 = 0x27a;
        goto LAB_00104eb5;
      }
      iVar1 = big_block_seek(&local_2a8,&local_2c8,offset);
      if (iVar1 != 0) {
        iVar1 = 0x27d;
LAB_00104e7b:
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,iVar1);
        iVar2 = big_block_mpi_flush(&local_2a8,comm);
        _big_block_close_internal(&local_2a8);
        iVar1 = 0x289;
        if (iVar2 == 0) {
          return -1;
        }
LAB_00104eb5:
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,iVar1);
        return -1;
      }
      iVar1 = _throttle_action(comm,concurrency,&local_2a8,&local_2c8,&local_258,big_block_write);
      if (iVar1 != 0) {
        iVar1 = 0x280;
        goto LAB_00104e7b;
      }
      iVar1 = big_block_mpi_flush(&local_2a8,comm);
      _big_block_close_internal(&local_2a8);
      if (iVar1 != 0) {
        iVar1 = 0x283;
        goto LAB_00104eb5;
      }
      uVar3 = uVar3 + 1;
      local_2f8 = local_2f8 + 0x20;
    } while (uVar3 < rtype->nfield);
  }
  return 0;
}

Assistant:

int
big_file_mpi_write_records(BigFile * bf,
    const BigRecordType * rtype,
    ptrdiff_t offset,
    size_t size,
    const void * buf,
    int concurrency,
    MPI_Comm comm)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigArray array[1];
        BigBlock block[1];
        BigBlockPtr ptr = {0};

        /* rainwoodman: cast away the const. We don't really modify it.*/
        RAISEIF(0 != big_record_view_field(rtype, i, array, size, (void*) buf),
            ex_array,
            NULL);
        RAISEIF(0 != big_file_mpi_open_block(bf, block, rtype->fields[i].name, comm),
            ex_open,
            NULL);
        RAISEIF(0 != big_block_seek(block, &ptr, offset),
            ex_seek,
            NULL);
        RAISEIF(0 != big_block_mpi_write(block, &ptr, array, concurrency, comm),
            ex_write,
            NULL);
        RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
        continue;
        ex_write:
        ex_seek:
            RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
        ex_array:
            return -1;
    }
    return 0;
}